

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFileBuffer.cpp
# Opt level: O2

bool TEST_getChar(void)

{
  bool bVar1;
  char cVar2;
  void *pvVar3;
  void *pvVar4;
  ifstream *this;
  int i;
  long lVar5;
  ulong uVar6;
  int count;
  ulong uVar7;
  allocator local_9a;
  allocator local_99;
  string sampleFilePath;
  FileBuffer bufferIntern;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string
            ((string *)&bufferIntern,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ALESysProg[P]sysprog/build_O2/src"
             ,&local_99);
  std::__cxx11::string::string((string *)&local_40,"/Testfiles/sample1.txt",&local_9a);
  std::operator+(&sampleFilePath,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bufferIntern,
                 &local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&bufferIntern);
  pvVar3 = operator_new__(10000);
  pvVar4 = operator_new__(10000);
  for (lVar5 = 0; lVar5 != 10000; lVar5 = lVar5 + 1) {
    *(undefined1 *)((long)pvVar4 + lVar5) = 0;
    *(undefined1 *)((long)pvVar3 + lVar5) = 0;
  }
  FileBuffer::FileBuffer(&bufferIntern,sampleFilePath._M_dataplus._M_p,500,2);
  uVar7 = 0;
  while( true ) {
    bVar1 = FileBuffer::isEnd(&bufferIntern);
    if (bVar1 || 9999 < uVar7) break;
    cVar2 = FileBuffer::getChar(&bufferIntern);
    *(char *)((long)pvVar3 + uVar7) = cVar2;
    uVar7 = uVar7 + 1;
  }
  this = (ifstream *)operator_new(0x208);
  std::ifstream::ifstream(this);
  std::ifstream::open((string *)this,(_Ios_Openmode)&sampleFilePath);
  std::istream::read((char *)this,(long)pvVar4);
  std::ifstream::close();
  uVar7 = 0;
  do {
    uVar6 = uVar7;
    if (uVar6 == 10000) break;
    uVar7 = uVar6 + 1;
  } while (*(char *)((long)pvVar3 + uVar6) == *(char *)((long)pvVar4 + uVar6));
  FileBuffer::~FileBuffer(&bufferIntern);
  std::__cxx11::string::~string((string *)&sampleFilePath);
  return 9999 < uVar6;
}

Assistant:

bool TEST_getChar() {
    // Define sample file
    string sampleFilePath = string(Compiler_PROJECT_BINARY_DIR) + string("/Testfiles/sample1.txt");

    // Create 2 buffers and empty them
    char *bufferOutputIntern = new char[10000];
    char *bufferOutputExtern = new char[10000];
    for (int i = 0; i < 10000; i++) {
        bufferOutputExtern[i] = '\0';
        bufferOutputIntern[i] = '\0';
    }

    // Load Buffer Intern
    FileBuffer bufferIntern = FileBuffer((char *) sampleFilePath.data());
    for (int count = 0; !bufferIntern.isEnd() && count < 10000; count++) {
        bufferOutputIntern[count] = bufferIntern.getChar();
    }

    // Load Buffer Extern
    ifstream* bufferExtern = new ifstream();
    bufferExtern->open(sampleFilePath);
    bufferExtern->read(bufferOutputExtern, 10000);
    bufferExtern->close();

    // Compare both buffers
    for (int i = 0; i < 10000; i++) {
        if (bufferOutputIntern[i] != bufferOutputExtern[i]) {
            return false;
        }
    }
    return true;
}